

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O1

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeRTASBuilderGetBuildPropertiesExtPrologue
          (ZEParameterValidation *this,ze_rtas_builder_ext_handle_t hBuilder,
          ze_rtas_builder_build_op_ext_desc_t *pBuildOpDescriptor,
          ze_rtas_builder_ext_properties_t *pProperties)

{
  ze_result_t zVar1;
  
  if (hBuilder != (ze_rtas_builder_ext_handle_t)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    if ((((pProperties != (ze_rtas_builder_ext_properties_t *)0x0 &&
           pBuildOpDescriptor != (ze_rtas_builder_build_op_ext_desc_t *)0x0) &&
         (zVar1 = ZE_RESULT_ERROR_INVALID_ENUMERATION,
         pBuildOpDescriptor->rtasFormat != ZE_RTAS_FORMAT_EXT_FORCE_UINT32)) &&
        ((int)pBuildOpDescriptor->buildQuality < 3)) &&
       (zVar1 = ZE_RESULT_ERROR_INVALID_ENUMERATION, pBuildOpDescriptor->buildFlags < 4)) {
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeRTASBuilderGetBuildPropertiesExtPrologue(
        ze_rtas_builder_ext_handle_t hBuilder,          ///< [in] handle of builder object
        const ze_rtas_builder_build_op_ext_desc_t* pBuildOpDescriptor,  ///< [in] pointer to build operation descriptor
        ze_rtas_builder_ext_properties_t* pProperties   ///< [in,out] query result for builder properties
        )
    {
        if( nullptr == hBuilder )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == pBuildOpDescriptor )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == pProperties )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( ZE_RTAS_FORMAT_EXT_MAX < pBuildOpDescriptor->rtasFormat )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        if( ZE_RTAS_BUILDER_BUILD_QUALITY_HINT_EXT_HIGH < pBuildOpDescriptor->buildQuality )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        if( 0x3 < pBuildOpDescriptor->buildFlags )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        auto retVal = ZE_RESULT_SUCCESS;
        retVal = ParameterValidation::validateExtensions(pBuildOpDescriptor);
        if(retVal)
            return retVal;
        retVal = ParameterValidation::validateExtensions(pProperties);
        return retVal;
    }